

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

BasicHeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateBasicHeapType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  initializer_list<wasm::HeapType> __l;
  bool bVar1;
  BasicHeapType id;
  value_type *pvVar2;
  bool local_d9;
  BasicHeapType local_b4;
  HeapType local_b0;
  value_type ht;
  allocator<wasm::HeapType> local_89;
  HeapType local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> options;
  HeapType ht_1;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  bVar1 = Random::oneIn(this->rand,0x10);
  if (bVar1) {
    id = Random::
         pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                   (this->rand,noext,nofunc,none);
    HeapType::HeapType((HeapType *)
                       &options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,id);
    this_local._4_4_ =
         HeapType::getBasic((HeapType *)
                            &options.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,share);
  }
  else {
    local_68 = 0x30;
    uStack_60 = 0x38;
    local_78 = 0x20;
    uStack_70 = 0x28;
    local_88.id = 0x10;
    uStack_80 = 8;
    local_58 = 0x40;
    local_50 = &local_88;
    local_48 = 7;
    std::allocator<wasm::HeapType>::allocator(&local_89);
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40,__l,&local_89);
    std::allocator<wasm::HeapType>::~allocator(&local_89);
    bVar1 = FeatureSet::hasExceptionHandling(&this->features);
    if ((bVar1) && (share == Unshared)) {
      HeapType::HeapType(&ht,exn);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40,&ht);
    }
    pvVar2 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this->rand,
                        (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
    local_b0.id = pvVar2->id;
    local_d9 = false;
    if (share == Unshared) {
      bVar1 = FeatureSet::hasSharedEverything(&this->features);
      local_d9 = false;
      if (bVar1) {
        local_b4 = exn;
        bVar1 = HeapType::operator!=(&local_b0,&local_b4);
        local_d9 = false;
        if (bVar1) {
          local_d9 = Random::oneIn(this->rand,2);
        }
      }
    }
    ht_1.id._4_4_ = share;
    if (local_d9 != false) {
      ht_1.id._4_4_ = Shared;
    }
    this_local._4_4_ = HeapType::getBasic(&local_b0,ht_1.id._4_4_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

HeapType::BasicHeapType generateBasicHeapType(Shareability share) {
    // Choose bottom types more rarely.
    // TODO: string and cont types
    if (rand.oneIn(16)) {
      HeapType ht =
        rand.pick(HeapType::noext, HeapType::nofunc, HeapType::none);
      return ht.getBasic(share);
    }

    std::vector<HeapType> options{HeapType::func,
                                  HeapType::ext,
                                  HeapType::any,
                                  HeapType::eq,
                                  HeapType::i31,
                                  HeapType::struct_,
                                  HeapType::array};
    // Avoid shared exn, which we cannot generate.
    if (features.hasExceptionHandling() && share == Unshared) {
      options.push_back(HeapType::exn);
    }
    auto ht = rand.pick(options);
    if (share == Unshared && features.hasSharedEverything() &&
        ht != HeapType::exn && rand.oneIn(2)) {
      share = Shared;
    }
    return ht.getBasic(share);
  }